

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

void __thiscall soplex::SPxDevexPR<double>::setupWeights(SPxDevexPR<double> *this,Type tp)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  VectorBase<double> *this_00;
  int in_ESI;
  long in_RDI;
  VectorBase<double> *coWeights;
  VectorBase<double> *weights;
  int weightSize;
  int coWeightSize;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  int iVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar5 = 0;
  iVar4 = 0;
  this_00 = (VectorBase<double> *)(*(long *)(in_RDI + 0x10) + 0x8b0);
  lVar2 = *(long *)(in_RDI + 0x10) + 0x8c8;
  if (in_ESI == -1) {
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e0dc9);
    VectorBase<double>::reDim
              ((VectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),iVar5,
               SUB41((uint)iVar4 >> 0x18,0));
    iVar1 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e0de5);
    while (iVar1 = iVar1 + -1, iVar5 <= iVar1) {
      pdVar3 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
      ;
      *pdVar3 = 2.0;
    }
    SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e0e35);
    VectorBase<double>::reDim
              ((VectorBase<double> *)CONCAT44(in_ESI,iVar1),iVar5,SUB41((uint)iVar4 >> 0x18,0));
    iVar5 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e0e51);
    while (iVar5 = iVar5 + -1, iVar4 <= iVar5) {
      pdVar3 = VectorBase<double>::operator[]
                         (this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      *pdVar3 = 2.0;
    }
  }
  else {
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e0ea2);
    VectorBase<double>::reDim
              ((VectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),iVar5,
               SUB41((uint)iVar4 >> 0x18,0));
    iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e0ebd);
    while (iVar4 = iVar4 + -1, iVar5 <= iVar4) {
      pdVar3 = VectorBase<double>::operator[](in_stack_ffffffffffffffc0,(int)((ulong)lVar2 >> 0x20))
      ;
      *pdVar3 = 1.0;
    }
  }
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x8e0) = 1;
  return;
}

Assistant:

void SPxDevexPR<R>::setupWeights(typename SPxSolverBase<R>::Type tp)
{
   int i;
   int coWeightSize = 0;
   int weightSize = 0;

   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(tp == SPxSolverBase<R>::ENTER)
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 2.0;

      weights.reDim(this->thesolver->coDim(), false);

      for(i = this->thesolver->coDim() - 1; i >= weightSize; --i)
         weights[i] = 2.0;
   }
   else
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 1.0;
   }

   this->thesolver->weightsAreSetup = true;
}